

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_container_xor(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  bool bVar1;
  int min;
  int local_2c;
  int local_28;
  int32_t pos2;
  int32_t pos1;
  int32_t neededcapacity;
  run_container_t *dst_local;
  run_container_t *src_2_local;
  run_container_t *src_1_local;
  
  min = src_1->n_runs + src_2->n_runs;
  if (dst->capacity < min) {
    run_container_grow(dst,min,false);
  }
  local_28 = 0;
  local_2c = 0;
  dst->n_runs = 0;
  while( true ) {
    bVar1 = false;
    if (local_28 < src_1->n_runs) {
      bVar1 = local_2c < src_2->n_runs;
    }
    if (!bVar1) break;
    if (src_2->runs[local_2c].value < src_1->runs[local_28].value) {
      run_container_smart_append_exclusive
                (dst,src_2->runs[local_2c].value,src_2->runs[local_2c].length);
      local_2c = local_2c + 1;
    }
    else {
      run_container_smart_append_exclusive
                (dst,src_1->runs[local_28].value,src_1->runs[local_28].length);
      local_28 = local_28 + 1;
    }
  }
  for (; local_28 < src_1->n_runs; local_28 = local_28 + 1) {
    run_container_smart_append_exclusive
              (dst,src_1->runs[local_28].value,src_1->runs[local_28].length);
  }
  for (; local_2c < src_2->n_runs; local_2c = local_2c + 1) {
    run_container_smart_append_exclusive
              (dst,src_2->runs[local_2c].value,src_2->runs[local_2c].length);
  }
  return;
}

Assistant:

void run_container_xor(const run_container_t *src_1,
                       const run_container_t *src_2, run_container_t *dst) {
    // don't bother to convert xor with full range into negation
    // since negation is implemented similarly

    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);

    int32_t pos1 = 0;
    int32_t pos2 = 0;
    dst->n_runs = 0;

    while ((pos1 < src_1->n_runs) && (pos2 < src_2->n_runs)) {
        if (src_1->runs[pos1].value <= src_2->runs[pos2].value) {
            run_container_smart_append_exclusive(dst, src_1->runs[pos1].value,
                                                 src_1->runs[pos1].length);
            pos1++;
        } else {
            run_container_smart_append_exclusive(dst, src_2->runs[pos2].value,
                                                 src_2->runs[pos2].length);
            pos2++;
        }
    }
    while (pos1 < src_1->n_runs) {
        run_container_smart_append_exclusive(dst, src_1->runs[pos1].value,
                                             src_1->runs[pos1].length);
        pos1++;
    }

    while (pos2 < src_2->n_runs) {
        run_container_smart_append_exclusive(dst, src_2->runs[pos2].value,
                                             src_2->runs[pos2].length);
        pos2++;
    }
}